

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_math.cpp
# Opt level: O2

bool pvmath::parallelLine<float>(void)

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  uint32_t uVar4;
  int iVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 in_register_00001404 [12];
  PointBase2D<float> point2;
  PointBase2D<float> point1;
  LineBase2D<float> line2;
  LineBase2D<float> line1;
  PointBase2D<float> local_70;
  PointBase2D<float> local_68;
  PointBase2D<float> local_60;
  PointBase2D<float> local_58;
  LineBase2D<float> local_50;
  LineBase2D<float> local_40;
  
  uVar2 = 0;
  do {
    uVar6 = uVar2;
    uVar4 = Test_Helper::runCount();
    if (uVar4 <= uVar6) break;
    iVar5 = rand();
    auVar12._0_4_ = (float)(iVar5 % 200000);
    auVar12._4_12_ = in_register_00001404;
    auVar9 = vfmadd213ss_fma(auVar12,SUB6416(ZEXT464(0x3c23d70a),0),SUB6416(ZEXT464(0xc47a0000),0));
    iVar5 = rand();
    auVar7._0_4_ = (float)(iVar5 % 200000);
    auVar7._4_12_ = in_register_00001404;
    auVar7 = vfmadd213ss_fma(auVar7,SUB6416(ZEXT464(0x3c23d70a),0),ZEXT416(0xc47a0000));
    local_68.y = auVar7._0_4_;
    local_68.x = auVar9._0_4_;
    iVar5 = rand();
    auVar10._0_4_ = (float)(iVar5 % 200000);
    auVar10._4_12_ = in_register_00001404;
    auVar9 = vfmadd213ss_fma(auVar10,SUB6416(ZEXT464(0x3c23d70a),0),ZEXT416(0xc47a0000));
    iVar5 = rand();
    auVar8._0_4_ = (float)(iVar5 % 200000);
    auVar8._4_12_ = in_register_00001404;
    auVar7 = vfmadd213ss_fma(auVar8,SUB6416(ZEXT464(0x3c23d70a),0),ZEXT416(0xc47a0000));
    local_70.y = auVar7._0_4_;
    local_70.x = auVar9._0_4_;
    LineBase2D<float>::LineBase2D(&local_40,&local_68,&local_70);
    iVar5 = rand();
    auVar11._0_4_ = (float)(iVar5 % 200000);
    auVar11._4_12_ = in_register_00001404;
    auVar7 = vfmadd213ss_fma(auVar11,SUB6416(ZEXT464(0x3c23d70a),0),ZEXT416(0xc47a0000));
    iVar5 = rand();
    auVar9._0_4_ = (float)(iVar5 % 200000);
    auVar9._4_12_ = in_register_00001404;
    auVar8 = vfmadd213ss_fma(auVar9,SUB6416(ZEXT464(0x3c23d70a),0),ZEXT416(0xc47a0000));
    bVar1 = (byte)uVar6;
    auVar9 = vinsertps_avx(ZEXT416((uint)(auVar7._0_4_ +
                                         (float)((uint)(bVar1 & 1) * (int)local_70.x +
                                                (uint)!(bool)(bVar1 & 1) * (int)local_68.x))),
                           ZEXT416((uint)(auVar8._0_4_ +
                                         (float)((uint)(bVar1 & 1) * (int)local_70.y +
                                                (uint)!(bool)(bVar1 & 1) * (int)local_68.y))),0x10);
    auVar7 = vinsertps_avx(ZEXT416((uint)(auVar7._0_4_ +
                                         (float)((uint)(bVar1 & 1) * (int)local_68.x +
                                                (uint)!(bool)(bVar1 & 1) * (int)local_70.x))),
                           ZEXT416((uint)(auVar8._0_4_ +
                                         (float)((uint)(bVar1 & 1) * (int)local_68.y +
                                                (uint)!(bool)(bVar1 & 1) * (int)local_70.y))),0x10);
    local_58 = (PointBase2D<float>)vmovlps_avx(auVar9);
    local_60 = (PointBase2D<float>)vmovlps_avx(auVar7);
    LineBase2D<float>::LineBase2D(&local_50,&local_58,&local_60);
    bVar3 = LineBase2D<float>::isParallel(&local_40,&local_50);
    uVar2 = uVar6 + 1;
  } while (bVar3);
  return uVar4 <= uVar6;
}

Assistant:

bool parallelLine()
    {
        for( uint32_t i = 0; i < Unit_Test::runCount(); ++i ) {
            const PointBase2D<_Type> point1( Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ), Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ) );
            const PointBase2D<_Type> point2( Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ), Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ) );
            const LineBase2D<_Type> line1( point1, point2 );

            const PointBase2D<_Type> offset( Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ), Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ) );
            const bool inverse = ( (i % 2) == 0 );
            const LineBase2D<_Type> line2( (inverse ? point1 : point2) + offset, (inverse ? point2 : point1) + offset );
            if ( !line1.isParallel( line2 ) )
                return false;
        }
        return true;
    }